

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.h
# Opt level: O3

void __thiscall bsplib::TicToc::~TicToc(TicToc *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  Time t;
  timespec local_38;
  
  lVar3 = s_timers;
  lVar4 = (ulong)this->m_record * 0x20;
  plVar5 = (long *)(s_timers + lVar4);
  lVar1 = *plVar5;
  lVar2 = plVar5[1];
  clock_gettime(1,&local_38);
  lVar6 = local_38.tv_sec - (this->m_start).tv_sec;
  local_38.tv_nsec = local_38.tv_nsec - (this->m_start).tv_nsec;
  if (local_38.tv_nsec < 1000000000) {
    if (local_38.tv_nsec < 0) {
      lVar6 = lVar6 + -1;
      local_38.tv_nsec = local_38.tv_nsec + 1000000000;
    }
  }
  else {
    lVar6 = lVar6 + 1;
    local_38.tv_nsec = local_38.tv_nsec + -1000000000;
  }
  lVar6 = lVar6 + lVar1;
  local_38.tv_nsec = local_38.tv_nsec + lVar2;
  plVar5 = (long *)(lVar3 + lVar4);
  if (local_38.tv_nsec < 1000000000) {
    if (local_38.tv_nsec < 0) {
      lVar6 = lVar6 + -1;
      local_38.tv_nsec = local_38.tv_nsec + 1000000000;
    }
  }
  else {
    lVar6 = lVar6 + 1;
    local_38.tv_nsec = local_38.tv_nsec + -1000000000;
  }
  *plVar5 = lVar6;
  plVar5[1] = local_38.tv_nsec;
  plVar5[2] = this->m_nbytes + plVar5[2];
  plVar5[3] = plVar5[3] + 1;
  pop();
  return;
}

Assistant:

~TicToc()
    {
        Record & r = s_timers[m_record];
        r.time = timeAdd( r.time, 
                timeDiff( getTime(), m_start ) );
        r.nbytes += m_nbytes;
        r.count += 1;
        pop();
    }